

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O3

idx_t duckdb::GetFileUrlOffset(string *path)

{
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  idx_t iVar4;
  bool bVar5;
  undefined1 *local_68;
  ulong local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  ulong local_40;
  undefined1 local_38 [16];
  
  pcVar1 = (path->_M_dataplus)._M_p;
  local_68 = local_58;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + path->_M_string_length);
  local_48 = local_38;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"file:/","");
  puVar2 = local_48;
  if (local_60 < local_40) {
    bVar5 = false;
  }
  else if (local_40 == 0) {
    bVar5 = true;
  }
  else {
    iVar3 = bcmp(local_48,local_68,local_40);
    bVar5 = iVar3 == 0;
  }
  if (puVar2 != local_38) {
    operator_delete(puVar2);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if (bVar5) {
    pcVar1 = (path->_M_dataplus)._M_p;
    iVar4 = 5;
    if ((pcVar1[6] == '/') && (iVar4 = 7, pcVar1[7] != '/')) {
      iVar3 = ::std::__cxx11::string::compare((ulong)path,7,(char *)0xa);
      iVar4 = (ulong)(iVar3 == 0) << 4;
    }
  }
  else {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static idx_t GetFileUrlOffset(const string &path) {
	if (!StringUtil::StartsWith(path, "file:/")) {
		return 0;
	}

	// Url without host: file:/some/path
	if (path[6] != '/') {
#ifdef _WIN32
		return 6;
#else
		return 5;
#endif
	}

	// Url with empty host: file:///some/path
	if (path[7] == '/') {
#ifdef _WIN32
		return 8;
#else
		return 7;
#endif
	}

	// Url with localhost: file://localhost/some/path
	if (path.compare(7, 10, "localhost/") == 0) {
#ifdef _WIN32
		return 17;
#else
		return 16;
#endif
	}

	// unkown file:/ url format
	return 0;
}